

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PrototypeChainCache.cpp
# Opt level: O2

void __thiscall
Js::ThreadCacheRegistry<Js::PrototypeChainCache<Js::OnlyWritablePropertyCache>_>::Clear
          (ThreadCacheRegistry<Js::PrototypeChainCache<Js::OnlyWritablePropertyCache>_> *this)

{
  DListBase<Js::ScriptCacheRegistry<Js::PrototypeChainCache<Js::OnlyWritablePropertyCache>_>_*,_RealCount>
  *pDVar1;
  code *pcVar2;
  bool bVar3;
  undefined4 *puVar4;
  DListBase<Js::ScriptCacheRegistry<Js::PrototypeChainCache<Js::OnlyWritablePropertyCache>_>_*,_RealCount>
  *pDVar5;
  ScriptCacheRegistry<Js::PrototypeChainCache<Js::OnlyWritablePropertyCache>_> **ppSVar6;
  bool bVar7;
  Iterator local_40;
  
  pDVar1 = &this->scriptRegistrations;
  local_40.list = pDVar1;
  local_40.current =
       &pDVar1->
        super_DListNodeBase<Js::ScriptCacheRegistry<Js::PrototypeChainCache<Js::OnlyWritablePropertyCache>_>_*>
  ;
  puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
  bVar7 = false;
  pDVar5 = pDVar1;
  while( true ) {
    if (pDVar5 == (DListBase<Js::ScriptCacheRegistry<Js::PrototypeChainCache<Js::OnlyWritablePropertyCache>_>_*,_RealCount>
                   *)0x0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      *puVar4 = 1;
      bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/DList.h"
                                  ,0x66,"(current != nullptr)","current != nullptr");
      if (!bVar3) {
        pcVar2 = (code *)invalidInstructionException();
        (*pcVar2)();
      }
      *puVar4 = 0;
      pDVar5 = (DListBase<Js::ScriptCacheRegistry<Js::PrototypeChainCache<Js::OnlyWritablePropertyCache>_>_*,_RealCount>
                *)local_40.current;
    }
    pDVar5 = (DListBase<Js::ScriptCacheRegistry<Js::PrototypeChainCache<Js::OnlyWritablePropertyCache>_>_*,_RealCount>
              *)(pDVar5->
                super_DListNodeBase<Js::ScriptCacheRegistry<Js::PrototypeChainCache<Js::OnlyWritablePropertyCache>_>_*>
                ).next.base;
    if (pDVar5 == local_40.list) break;
    local_40.current = (NodeBase *)pDVar5;
    ppSVar6 = DListBase<Js::ScriptCacheRegistry<Js::PrototypeChainCache<Js::OnlyWritablePropertyCache>_>_*,_RealCount>
              ::Iterator::Data(&local_40);
    ScriptCacheRegistry<Js::PrototypeChainCache<Js::OnlyWritablePropertyCache>_>::Clear
              (*ppSVar6,true);
    bVar7 = true;
    pDVar5 = (DListBase<Js::ScriptCacheRegistry<Js::PrototypeChainCache<Js::OnlyWritablePropertyCache>_>_*,_RealCount>
              *)local_40.current;
  }
  if (bVar7) {
    (this->scriptRegistrations).
    super_DListNodeBase<Js::ScriptCacheRegistry<Js::PrototypeChainCache<Js::OnlyWritablePropertyCache>_>_*>
    .next.node = (DListNode<Js::ScriptCacheRegistry<Js::PrototypeChainCache<Js::OnlyWritablePropertyCache>_>_*>
                  *)pDVar1;
    (this->scriptRegistrations).
    super_DListNodeBase<Js::ScriptCacheRegistry<Js::PrototypeChainCache<Js::OnlyWritablePropertyCache>_>_*>
    .prev.base = &pDVar1->
                  super_DListNodeBase<Js::ScriptCacheRegistry<Js::PrototypeChainCache<Js::OnlyWritablePropertyCache>_>_*>
    ;
    (this->scriptRegistrations).super_RealCount.count = 0;
    Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::Reset
              ((ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL> *)this);
  }
  return;
}

Assistant:

void
ThreadCacheRegistry<T>::Clear()
{
    bool hasItem = false;
    FOREACH_DLISTBASE_ENTRY(ScriptCacheRegistry<T>*, registration, &this->scriptRegistrations)
    {
        registration->Clear(true /* isThreadClear */);
        hasItem = true;
    }
    NEXT_DLISTBASE_ENTRY;

    if (!hasItem)
    {
        return;
    }

    this->scriptRegistrations.Reset();
    this->arena.Reset();
}